

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.cpp
# Opt level: O1

void cashew::dump(char *str,Ref node,bool pretty)

{
  size_t sVar1;
  
  if (str == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10d45e8);
  }
  else {
    sVar1 = strlen(str);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,str,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
  if ((node.inst == (Value *)0x0) || ((node.inst)->type == Null)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(nullptr)",9);
  }
  else {
    Value::stringify(node.inst,(ostream *)&std::cerr,pretty);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return;
}

Assistant:

void dump(const char* str, Ref node, bool pretty) {
  std::cerr << str << ": ";
  if (!!node) {
    node->stringify(std::cerr, pretty);
  } else {
    std::cerr << "(nullptr)";
  }
  std::cerr << std::endl;
}